

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDataDependenceAnalysis.cpp
# Opt level: O3

vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> * __thiscall
dg::dda::LLVMDataDependenceAnalysis::getLLVMDefinitions
          (vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *__return_storage_ptr__,
          LLVMDataDependenceAnalysis *this,Value *use)

{
  pointer *pppVVar1;
  long *plVar2;
  iterator __position;
  iterator iVar3;
  long lVar4;
  raw_ostream *prVar5;
  const_iterator cVar6;
  size_t sVar7;
  char *pcVar8;
  Value *pVVar9;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> rdDefs;
  key_type local_48;
  Value *local_40;
  Value *local_38;
  long local_30;
  
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = use;
  iVar3 = std::
          _Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::NodesSeq<dg::dda::RWNode>_>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::NodesSeq<dg::dda::RWNode>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::NodesSeq<dg::dda::RWNode>_>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::NodesSeq<dg::dda::RWNode>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(*(long *)(this + 0xb0) + 0x48),&local_40);
  if ((iVar3.
       super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::NodesSeq<dg::dda::RWNode>_>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (plVar2 = *(long **)((long)iVar3.
                                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::NodesSeq<dg::dda::RWNode>_>,_false>
                                ._M_cur + 0x28), plVar2 == (long *)0x0)) {
    prVar5 = (raw_ostream *)llvm::errs();
    pcVar8 = "[DDA] error: no node for: ";
    sVar7 = 0x1a;
  }
  else {
    lVar4 = (**(code **)(*plVar2 + 0x10))(plVar2);
    if (*(long *)(lVar4 + 0x88) != 0) {
      if ((use[0x10] != (Value)0x3b) && (use[0x10] != (Value)0x53)) {
        prVar5 = (raw_ostream *)llvm::errs();
        Str.Length = 0x2d;
        Str.Data = "[DDA] error: the queried value is not a use: ";
        prVar5 = llvm::raw_ostream::operator<<(prVar5,Str);
        llvm::Value::print((raw_ostream *)use,SUB81(prVar5,0));
        Str_00.Length = 1;
        Str_00.Data = "\n";
        llvm::raw_ostream::operator<<(prVar5,Str_00);
      }
      (**(code **)(*(long *)**(undefined8 **)(this + 0xb8) + 0x20))
                (&local_40,(long *)**(undefined8 **)(this + 0xb8),plVar2);
      for (pVVar9 = local_40; pVVar9 != local_38; pVVar9 = pVVar9 + 8) {
        local_48 = *(key_type *)pVVar9;
        cVar6 = std::
                _Hashtable<const_dg::dda::RWNode_*,_std::pair<const_dg::dda::RWNode_*const,_const_llvm::Value_*>,_std::allocator<std::pair<const_dg::dda::RWNode_*const,_const_llvm::Value_*>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWNode_*>,_std::hash<const_dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<const_dg::dda::RWNode_*,_std::pair<const_dg::dda::RWNode_*const,_const_llvm::Value_*>,_std::allocator<std::pair<const_dg::dda::RWNode_*const,_const_llvm::Value_*>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWNode_*>,_std::hash<const_dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)(*(long *)(this + 0xb0) + 0x80),&local_48);
        if (cVar6.
            super__Node_iterator_base<std::pair<const_dg::dda::RWNode_*const,_const_llvm::Value_*>,_false>
            ._M_cur == (__node_type *)0x0) {
          local_48 = (key_type)0x0;
        }
        else {
          local_48 = *(key_type *)
                      ((long)cVar6.
                             super__Node_iterator_base<std::pair<const_dg::dda::RWNode_*const,_const_llvm::Value_*>,_false>
                             ._M_cur + 0x10);
        }
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::Value*,std::allocator<llvm::Value*>>::_M_realloc_insert<llvm::Value*>
                    ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)__return_storage_ptr__,
                     __position,(Value **)&local_48);
        }
        else {
          *__position._M_current = (Value *)local_48;
          pppVVar1 = &(__return_storage_ptr__->
                      super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppVVar1 = *pppVVar1 + 1;
        }
      }
      if (local_40 == (Value *)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_40,local_30 - (long)local_40);
      return __return_storage_ptr__;
    }
    prVar5 = (raw_ostream *)llvm::errs();
    pcVar8 = "[DDA] error: the queried value has empty uses: ";
    sVar7 = 0x2f;
  }
  Str_01.Length = sVar7;
  Str_01.Data = pcVar8;
  prVar5 = llvm::raw_ostream::operator<<(prVar5,Str_01);
  llvm::Value::print((raw_ostream *)use,SUB81(prVar5,0));
  Str_02.Length = 1;
  Str_02.Data = "\n";
  llvm::raw_ostream::operator<<(prVar5,Str_02);
  return __return_storage_ptr__;
}

Assistant:

std::vector<llvm::Value *>
LLVMDataDependenceAnalysis::getLLVMDefinitions(llvm::Value *use) {
    std::vector<llvm::Value *> defs;

    auto *loc = getNode(use);
    if (!loc) {
        llvm::errs() << "[DDA] error: no node for: " << *use << "\n";
        return defs;
    }

    if (loc->getUses().empty()) {
        llvm::errs() << "[DDA] error: the queried value has empty uses: "
                     << *use << "\n";
        return defs;
    }

    if (!llvm::isa<llvm::LoadInst>(use) && !llvm::isa<llvm::CallInst>(use)) {
        llvm::errs() << "[DDA] error: the queried value is not a use: " << *use
                     << "\n";
    }

    auto rdDefs = getDefinitions(loc);
#ifndef NDEBUG
    if (rdDefs.empty()) {
        if (!loc->usesOnlyGlobals()) {
            static std::set<const llvm::Value *> reported;
            if (reported.insert(use).second) {
                llvm::errs()
                        << "[DDA] warn: no definitions for: " << *use << "\n";
            }
        }
    }
#endif // NDEBUG

    // map the values
    for (RWNode *nd : rdDefs) {
        assert(nd->getType() != RWNodeType::PHI);
        const auto *llvmvalue = getValue(nd);
        assert(llvmvalue && "Have no value for a node");
        defs.push_back(const_cast<llvm::Value *>(llvmvalue));
    }

    return defs;
}